

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O3

unsigned_long
duckdb::MultiplyOperatorOverflowCheck::Operation<unsigned_long,unsigned_long,unsigned_long>
          (unsigned_long left,unsigned_long right)

{
  unsigned_long uVar1;
  OutOfRangeException *this;
  unsigned_long uVar2;
  ulong uVar3;
  PhysicalType type;
  ulong uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  uVar2 = right;
  if (right < left) {
    uVar2 = left;
  }
  uVar1 = right;
  if (left < right) {
    uVar1 = left;
  }
  uVar4 = uVar1 >> 0x20;
  uVar6 = right;
  if (uVar4 == 0) {
    uVar4 = (uVar2 >> 0x20) * uVar1;
    uVar6 = uVar4 >> 0x20;
    if (uVar6 == 0) {
      uVar3 = (uVar2 & 0xffffffff) * uVar1;
      uVar5 = uVar4 << 0x20;
      uVar4 = uVar5 + uVar3;
      if (!CARRY8(uVar5,uVar3)) {
        return right * left;
      }
    }
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10,uVar6,uVar4);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Overflow in multiplication of %s (%s * %s)!","");
  TypeIdToString_abi_cxx11_(&local_48,(duckdb *)0x8,type);
  NumericHelper::ToString<unsigned_long>(&local_68,left);
  NumericHelper::ToString<unsigned_long>(&local_88,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
             &local_68,&local_88);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryMultiplyOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in multiplication of %s (%s * %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}